

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrMapImpl::reconcileDefaultAttributes
          (DOMAttrMapImpl *this,DOMAttrMapImpl *defaults)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar4;
  DOMAttrImpl *newAttrImpl;
  DOMAttr *newAttr;
  DOMAttr *attr_1;
  XMLSize_t n;
  XMLSize_t dsize;
  DOMAttr *attr;
  XMLSize_t i;
  XMLSize_t nsize;
  DOMAttrMapImpl *defaults_local;
  DOMAttrMapImpl *this_local;
  
  iVar1 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
  for (attr = (DOMAttr *)CONCAT44(extraout_var,iVar1); attr != (DOMAttr *)0x0;
      attr = (DOMAttr *)((long)&attr[-1].super_DOMNode._vptr_DOMNode + 7)) {
    iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])();
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x148))();
    if ((uVar3 & 1) == 0) {
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0x10])();
    }
  }
  (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this,0);
  if (defaults != (DOMAttrMapImpl *)0x0) {
    (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this,1);
    if ((DOMAttr *)CONCAT44(extraout_var,iVar1) == (DOMAttr *)0x0) {
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])(this,defaults);
    }
    else {
      iVar1 = (*(defaults->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
      for (attr_1 = (DOMAttr *)0x0; attr_1 < (DOMAttr *)CONCAT44(extraout_var_01,iVar1);
          attr_1 = (DOMAttr *)((long)&(attr_1->super_DOMNode)._vptr_DOMNode + 1)) {
        iVar2 = (*(defaults->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(defaults,attr_1);
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x68))
                                   ((long *)CONCAT44(extraout_var_02,iVar2),1);
        (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[8])(this,plVar4);
        (**(code **)(*plVar4 + 0x198))(plVar4,0);
      }
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::reconcileDefaultAttributes(const DOMAttrMapImpl* defaults) {

    // remove any existing default
    XMLSize_t nsize = getLength();
    for (XMLSize_t i = nsize; i > 0; i--) {
        DOMAttr* attr = (DOMAttr*)item(i-1);
        if (!attr->getSpecified()) {
            removeNamedItemAt(i-1);
        }
    }

    hasDefaults(false);

    // add the new defaults
    if (defaults) {
        hasDefaults(true);

        if (nsize == 0) {
            cloneContent(defaults);
        }
        else {
            XMLSize_t dsize = defaults->getLength();
            for (XMLSize_t n = 0; n < dsize; n++) {
                DOMAttr* attr = (DOMAttr*)defaults->item(n);

                DOMAttr* newAttr = (DOMAttr*)attr->cloneNode(true);
                setNamedItemNS(newAttr);
                DOMAttrImpl* newAttrImpl = (DOMAttrImpl*) newAttr;
                newAttrImpl->setSpecified(false);
            }
        }
    }
}